

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Robot.cpp
# Opt level: O2

void __thiscall Robot::communicate(Robot *this)

{
  Serial *pSVar1;
  allocator local_b1;
  string local_b0;
  string local_90;
  string result;
  string local_50;
  
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  writeDuty(this);
  pSVar1 = this->mySerial;
  std::__cxx11::string::string((string *)&local_b0,"\n",&local_b1);
  serial::Serial::readline(&local_90,pSVar1,0x18,&local_b0);
  std::__cxx11::string::operator=((string *)&result,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  setCount(this,&result);
  do {
    local_90._M_dataplus._M_p = (pointer)0xa;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&local_90);
    writeDuty(this);
    pSVar1 = this->mySerial;
    std::__cxx11::string::string((string *)&local_50,"\n",&local_b1);
    serial::Serial::readline(&local_90,pSVar1,0x18,&local_50);
    std::__cxx11::string::operator=((string *)&result,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    setCount(this,&result);
    calcSpeed(this);
    calcVelocityAndTheta(this);
    calcWorldVelocity(this);
    calcPosition(this);
  } while( true );
}

Assistant:

void Robot::communicate() {
    std::string result;
    this->writeDuty();
    result = this->mySerial->readline(24, "\n");
    this->setCount(result);
    while(true) {
        std::this_thread::sleep_for(std::chrono::milliseconds(10));
        this->writeDuty();
        result = this->mySerial->readline(24, "\n");
        this->setCount(result);
        this->calcSpeed();
        /*std::cout << this->robotInfo.wheelVelocity[0] << "\t" << this->robotInfo.wheelVelocity[1]
        << "\t" << this->robotInfo.wheelVelocity[2] << std::endl;*/
        this->calcVelocityAndTheta();
        this->calcWorldVelocity();
        this->calcPosition();
    }
}